

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O0

void Abc_TgFlipSymGroupByVar(Abc_TgMan_t *pMan,int iVar)

{
  int local_14;
  int iVar_local;
  Abc_TgMan_t *pMan_local;
  
  for (local_14 = iVar; -1 < local_14; local_14 = (int)pMan->symLink[local_14]) {
    if (pMan->symPhase[local_14] != '\0') {
      Abc_TgFlipVar(pMan,local_14);
    }
  }
  return;
}

Assistant:

static inline void Abc_TgFlipSymGroupByVar(Abc_TgMan_t* pMan, int iVar)
{
    for (; iVar >= 0; iVar = pMan->symLink[iVar])
        if (pMan->symPhase[iVar])
            Abc_TgFlipVar(pMan, iVar);
}